

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_aes_xts.c
# Opt level: O0

void * aes_xts_newctx(void *provctx,uint mode,uint64_t flags,size_t kbits,size_t blkbits,
                     size_t ivbits)

{
  void *ivbits_00;
  PROV_CIPHER_HW *flags_00;
  size_t in_RCX;
  PROV_CIPHER_HW *in_RDX;
  size_t in_R8;
  void *in_R9;
  PROV_AES_XTS_CTX *ctx;
  undefined8 in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  void *provctx_00;
  
  ivbits_00 = CRYPTO_zalloc(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                            (int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  provctx_00 = ivbits_00;
  if (ivbits_00 != (void *)0x0) {
    flags_00 = ossl_prov_cipher_hw_aes_xts(in_RCX);
    ossl_cipher_generic_initkey
              (in_R9,in_R8,in_RCX,(size_t)ivbits_00,0,(uint64_t)flags_00,in_RDX,provctx_00);
  }
  return provctx_00;
}

Assistant:

static void *aes_xts_newctx(void *provctx, unsigned int mode, uint64_t flags,
                            size_t kbits, size_t blkbits, size_t ivbits)
{
    PROV_AES_XTS_CTX *ctx = OPENSSL_zalloc(sizeof(*ctx));

    if (ctx != NULL) {
        ossl_cipher_generic_initkey(&ctx->base, kbits, blkbits, ivbits, mode,
                                    flags, ossl_prov_cipher_hw_aes_xts(kbits),
                                    NULL);
    }
    return ctx;
}